

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O3

int __thiscall QPDF::getExtensionLevel(QPDF *this)

{
  undefined8 uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  QPDFObjectHandle local_28;
  
  getRoot((QPDF *)local_58);
  local_48._M_allocated_capacity = (size_type)&local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_58 + 0x10),"/Extensions","");
  bVar3 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_58,(string *)(local_58 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_allocated_capacity != &local_38) {
    operator_delete((void *)local_48._M_allocated_capacity,local_38._M_allocated_capacity + 1);
  }
  iVar5 = 0;
  iVar4 = 0;
  if (bVar3) {
    local_48._M_allocated_capacity = (size_type)&local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_58 + 0x10),"/Extensions","");
    QPDFObjectHandle::getKey(&local_28,(string *)local_58);
    _Var2._M_pi = local_28.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_58._0_8_ =
         local_28.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    uVar1 = local_58._8_8_;
    local_28.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_28.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58._8_8_ = _Var2._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar1 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar1);
      if (local_28.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_28.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_allocated_capacity != &local_38) {
      operator_delete((void *)local_48._M_allocated_capacity,local_38._M_allocated_capacity + 1);
    }
    bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_58);
    iVar4 = iVar5;
    if (bVar3) {
      local_48._M_allocated_capacity = (size_type)&local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_58 + 0x10),"/ADBE","");
      bVar3 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_58,(string *)(local_58 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_allocated_capacity != &local_38) {
        operator_delete((void *)local_48._M_allocated_capacity,local_38._M_allocated_capacity + 1);
      }
      if (bVar3) {
        local_48._M_allocated_capacity = (size_type)&local_38;
        std::__cxx11::string::_M_construct<char_const*>((string *)(local_58 + 0x10),"/ADBE","");
        QPDFObjectHandle::getKey(&local_28,(string *)local_58);
        _Var2._M_pi = local_28.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        local_58._0_8_ =
             local_28.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar1 = local_58._8_8_;
        local_28.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        local_28.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_58._8_8_ = _Var2._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar1 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar1);
          if (local_28.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_28.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_allocated_capacity != &local_38) {
          operator_delete((void *)local_48._M_allocated_capacity,local_38._M_allocated_capacity + 1)
          ;
        }
        bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_58);
        if (bVar3) {
          local_48._M_allocated_capacity = (size_type)&local_38;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_58 + 0x10),"/ExtensionLevel","");
          bVar3 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_58,(string *)(local_58 + 0x10))
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_allocated_capacity != &local_38) {
            operator_delete((void *)local_48._M_allocated_capacity,
                            local_38._M_allocated_capacity + 1);
          }
          if (bVar3) {
            local_48._M_allocated_capacity = (size_type)&local_38;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(local_58 + 0x10),"/ExtensionLevel","");
            QPDFObjectHandle::getKey(&local_28,(string *)local_58);
            _Var2._M_pi = local_28.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi;
            local_58._0_8_ =
                 local_28.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            uVar1 = local_58._8_8_;
            local_28.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            local_28.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_58._8_8_ = _Var2._M_pi;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar1 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar1);
              if (local_28.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_28.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_48._M_allocated_capacity != &local_38) {
              operator_delete((void *)local_48._M_allocated_capacity,
                              local_38._M_allocated_capacity + 1);
            }
            bVar3 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_58);
            if (bVar3) {
              iVar4 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)local_58);
            }
          }
        }
      }
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  return iVar4;
}

Assistant:

int
QPDF::getExtensionLevel()
{
    int result = 0;
    QPDFObjectHandle obj = getRoot();
    if (obj.hasKey("/Extensions")) {
        obj = obj.getKey("/Extensions");
        if (obj.isDictionary() && obj.hasKey("/ADBE")) {
            obj = obj.getKey("/ADBE");
            if (obj.isDictionary() && obj.hasKey("/ExtensionLevel")) {
                obj = obj.getKey("/ExtensionLevel");
                if (obj.isInteger()) {
                    result = obj.getIntValueAsInt();
                }
            }
        }
    }
    return result;
}